

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::GetChannel
          (Error *__return_storage_ptr__,CommissionerApp *this,Channel *aChannel)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  Error *aError;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar4;
  format_args args;
  string_view fmt;
  ErrorCode local_164;
  Error local_160;
  anon_class_1_0_00000001 local_132;
  v10 local_131;
  v10 *local_130;
  size_t local_128;
  string local_120;
  Error local_100;
  undefined1 local_c1;
  Channel *local_c0;
  Channel *aChannel_local;
  CommissionerApp *this_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  Error **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  local_c1 = 0;
  local_c0 = aChannel;
  aChannel_local = (Channel *)this;
  this_local = (CommissionerApp *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  uVar2 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])();
  if ((uVar2 & 1) == 0) {
    GetChannel::anon_class_1_0_00000001::operator()(&local_132);
    local_58 = &local_130;
    local_60 = &local_131;
    bVar4 = ::fmt::v10::operator()(local_60);
    local_128 = bVar4.size_;
    local_130 = (v10 *)bVar4.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_120;
    local_78 = local_130;
    sStack_70 = local_128;
    local_50 = &local_78;
    local_88 = local_130;
    local_80 = local_128;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_18 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    local_28 = local_38;
    local_20 = local_38;
    local_10 = local_30;
    ::fmt::v10::vformat_abi_cxx11_(&local_120,local_88,fmt,args);
    Error::Error(&local_100,kInvalidState,&local_120);
    Error::operator=(__return_storage_ptr__,&local_100);
    Error::~Error(&local_100);
    std::__cxx11::string::~string((string *)&local_120);
  }
  else {
    peVar3 = std::
             __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->mCommissioner);
    (*peVar3->_vptr_Commissioner[0x1a])(&local_160,peVar3,&this->mActiveDataset,0xffff);
    aError = Error::operator=(__return_storage_ptr__,&local_160);
    local_164 = kNone;
    bVar1 = commissioner::operator!=(aError,&local_164);
    Error::~Error(&local_160);
    if (!bVar1) {
      if (((this->mActiveDataset).mPresentFlags & 0x4000) == 0) {
        abort();
      }
      *local_c0 = (this->mActiveDataset).mChannel;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::GetChannel(Channel &aChannel)
{
    Error error;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    // Since channel will be updated by pending operational after a delay time,
    // we need to pull the active operational dataset.

    // TODO(wgtdkp): should we send MGMT_ACTIVE_GET.req for all GetXXX APIs ?
    SuccessOrExit(error = mCommissioner->GetActiveDataset(mActiveDataset, 0xFFFF));

    VerifyOrDie(mActiveDataset.mPresentFlags & ActiveOperationalDataset::kChannelBit);

    aChannel = mActiveDataset.mChannel;

exit:
    return error;
}